

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O1

bool __thiscall
pdqsort_detail::
partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__1>
          (pdqsort_detail *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
          anon_class_16_2_fd512ddf comp)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  pdqsort_detail *ppVar10;
  pdqsort_detail *ppVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  pdqsort_detail *ppVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  double dVar24;
  
  if (this == (pdqsort_detail *)begin._M_current) {
    bVar21 = true;
  }
  else {
    lVar9 = 0;
    uVar19 = 0;
    ppVar10 = this;
    do {
      ppVar11 = ppVar10 + 4;
      bVar21 = ppVar11 == (pdqsort_detail *)begin._M_current;
      if (bVar21) {
        return bVar21;
      }
      iVar6 = *(int *)(ppVar10 + 4);
      lVar15 = (long)*(int *)ppVar10;
      lVar18 = (long)iVar6;
      lVar7 = *(long *)(end._M_current + 0x14);
      dVar2 = *(double *)(lVar7 + lVar18 * 8);
      if ((1.5 <= dVar2) || (*(double *)(lVar7 + lVar15 * 8) <= 1.5)) {
        if ((dVar2 <= 1.5) ||
           (pdVar1 = (double *)(lVar7 + lVar15 * 8), 1.5 < *pdVar1 || *pdVar1 == 1.5)) {
          dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
          dVar23 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
          dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar15 * 8);
          dVar24 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar15 * 8) * dVar4;
          dVar5 = *(double *)(end._M_current + 0x2c);
          if (dVar24 + dVar5 < dVar23) goto LAB_00287bf8;
          if (dVar24 - dVar5 <= dVar23) {
            if (ABS(dVar3 - dVar4) <= dVar5) {
              uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
              uVar16 = (ulong)*(uint *)&(comp.this)->lpRelaxation;
              lVar14 = uVar16 + 0x8a183895eeac1536;
              lVar12 = uVar16 + 0x80c8963be3e4c2f3;
              uVar16 = (uVar8 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^
                       (uVar8 + 0x42d8680e260ae5b) * lVar14;
              uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar15 * 4);
              uVar8 = (uVar8 + 0xc8497d2a400d9551) * lVar12 >> 0x20 ^
                      (uVar8 + 0x42d8680e260ae5b) * lVar14;
              bVar20 = uVar16 < uVar8;
              bVar22 = uVar16 == uVar8;
            }
            else {
              bVar22 = dVar3 == dVar4;
              bVar20 = dVar3 < dVar4;
            }
            if (!bVar20 && !bVar22) goto LAB_00287bf8;
          }
        }
      }
      else {
LAB_00287bf8:
        *(int *)(ppVar10 + 4) = *(int *)ppVar10;
        ppVar17 = ppVar10;
        if (ppVar10 != this) {
          lVar15 = 0;
          do {
            lVar14 = (long)*(int *)(ppVar10 + lVar15 + -4);
            if ((1.5 <= dVar2) || (*(double *)(lVar7 + lVar14 * 8) <= 1.5)) {
              if ((1.5 < dVar2) &&
                 (pdVar1 = (double *)(lVar7 + lVar14 * 8), *pdVar1 <= 1.5 && *pdVar1 != 1.5)) break;
              dVar3 = *(double *)(*(long *)(end._M_current + 0x30) + lVar18 * 8);
              dVar23 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar18 * 8) * dVar3;
              dVar4 = *(double *)(*(long *)(end._M_current + 0x30) + lVar14 * 8);
              dVar24 = *(double *)(*(long *)(end._M_current + 0x1a) + lVar14 * 8) * dVar4;
              dVar5 = *(double *)(end._M_current + 0x2c);
              if (dVar23 <= dVar24 + dVar5) {
                if (dVar23 < dVar24 - dVar5) goto LAB_00287d9c;
                if (ABS(dVar3 - dVar4) <= dVar5) {
                  uVar16 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar18 * 4);
                  uVar8 = (ulong)*(uint *)&(comp.this)->lpRelaxation;
                  lVar12 = uVar8 + 0x8a183895eeac1536;
                  lVar13 = uVar8 + 0x80c8963be3e4c2f3;
                  uVar16 = (uVar16 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                           (uVar16 + 0x42d8680e260ae5b) * lVar12;
                  uVar8 = (ulong)*(uint *)(*(long *)(end._M_current + 0x32) + lVar14 * 4);
                  uVar8 = (uVar8 + 0xc8497d2a400d9551) * lVar13 >> 0x20 ^
                          (uVar8 + 0x42d8680e260ae5b) * lVar12;
                  bVar20 = uVar16 < uVar8;
                  bVar22 = uVar16 == uVar8;
                }
                else {
                  bVar22 = dVar3 == dVar4;
                  bVar20 = dVar3 < dVar4;
                }
                if (bVar20 || bVar22) goto LAB_00287d9c;
              }
            }
            ppVar17 = ppVar17 + -4;
            *(undefined4 *)(ppVar10 + lVar15) = *(undefined4 *)(ppVar10 + lVar15 + -4);
            lVar15 = lVar15 + -4;
          } while (lVar9 != lVar15);
          ppVar17 = ppVar10 + lVar15;
        }
LAB_00287d9c:
        *(int *)ppVar17 = iVar6;
        uVar19 = uVar19 + ((long)ppVar11 - (long)ppVar17 >> 2);
      }
      lVar9 = lVar9 + -4;
      ppVar10 = ppVar11;
    } while (uVar19 < 9);
  }
  return bVar21;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }